

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

size_t __thiscall google::protobuf::internal::ExtensionSet::MessageSetByteSize(ExtensionSet *this)

{
  size_t sVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  size_t total_size;
  size_t local_18;
  
  local_18 = 0;
  pKVar2 = (this->map_).flat;
  if (this->flat_capacity_ < 0x101) {
    if (this->flat_size_ != 0) {
      pKVar3 = pKVar2 + this->flat_size_;
      do {
        sVar1 = Extension::MessageSetItemByteSize(&pKVar2->second,pKVar2->first);
        local_18 = local_18 + sVar1;
        pKVar2 = pKVar2 + 1;
      } while (pKVar2 != pKVar3);
    }
  }
  else {
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::MessageSetByteSize()const::__0>
              ((_Base_ptr)(pKVar2->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar2->second,(anon_class_8_1_736c71da)&local_18);
  }
  return local_18;
}

Assistant:

size_t ExtensionSet::MessageSetByteSize() const {
  size_t total_size = 0;
  ForEach([&total_size](int number, const Extension& ext) {
    total_size += ext.MessageSetItemByteSize(number);
  });
  return total_size;
}